

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimam.cpp
# Opt level: O3

bool data_is_subset(BtorSimArrayModel *self,BtorSimArrayModel *other)

{
  _Bool _Var1;
  int iVar2;
  const_iterator cVar3;
  uint64_t uVar4;
  BtorSimBitVector *b;
  undefined8 uVar5;
  _Hash_node_base *p_Var6;
  value_type i;
  key_type local_60;
  BtorSimBitVector *local_40;
  BtorSimBitVector *local_38;
  
  p_Var6 = (self->data)._M_h._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,p_Var6[1]._M_nxt,
                 (long)&(p_Var6[1]._M_nxt)->_M_nxt + (long)&(p_Var6[2]._M_nxt)->_M_nxt);
      local_40 = (BtorSimBitVector *)p_Var6[5]._M_nxt;
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(other->data)._M_h,&local_60);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        if (other->const_init != (BtorSimBitVector *)0x0) {
          iVar2 = btorsim_bv_compare(local_40,other->const_init);
          goto joined_r0x0010a247;
        }
        if (other->random_seed != 0) {
          local_38 = btorsim_bv_char_to_bv(local_60._M_dataplus._M_p);
          uVar4 = btorsim_bv_to_uint64(local_38);
          b = btorsim_bv_uint64_to_bv
                        (((other->random_seed + uVar4) * (other->random_seed + uVar4 + 1) >> 1) +
                         uVar4,(uint32_t)other->element_width);
          iVar2 = btorsim_bv_compare(local_40,b);
          btorsim_bv_free(local_38);
          btorsim_bv_free(b);
          goto joined_r0x0010a247;
        }
        _Var1 = btorsim_bv_is_zero(local_40);
        if (!_Var1) goto LAB_0010a261;
      }
      else {
        cVar3 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(other->data)._M_h,&local_60);
        if (cVar3.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          uVar5 = std::__throw_out_of_range("_Map_base::at");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
          _Unwind_Resume(uVar5);
        }
        iVar2 = btorsim_bv_compare(*(BtorSimBitVector **)
                                    ((long)cVar3.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
                                           ._M_cur + 0x28),local_40);
joined_r0x0010a247:
        if (iVar2 != 0) {
LAB_0010a261:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
          return false;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  return true;
}

Assistant:

bool
data_is_subset (const BtorSimArrayModel& self, const BtorSimArrayModel& other)
{
  for (auto i : self.data)
  // check all accessed elements in self have same value in other
  {
    if (other.data.find (i.first) == other.data.end ())
    // data is not in other, but may be same as initial value if an extra read
    // was called on self
    {
      if (other.const_init)  // init value is from init statement
      {
        if (btorsim_bv_compare (i.second, other.const_init)) return false;
      }
      else if (other.random_seed)  // init value is from randomize
      {
        BtorSimBitVector* idx     = btorsim_bv_char_to_bv (i.first.c_str ());
        BtorSimBitVector* initval = btorsim_bv_uint64_to_bv (
            other.get_random_init (btorsim_bv_to_uint64 (idx)),
            other.element_width);
        int is_different_from_random_init =
            btorsim_bv_compare (i.second, initval);
        btorsim_bv_free (idx);
        btorsim_bv_free (initval);
        if (is_different_from_random_init) return false;
      }
      else  // init value is zero
      {
        if (!btorsim_bv_is_zero (i.second)) return false;
      }
    }
    else if (btorsim_bv_compare (other.data.at (i.first), i.second) != 0)
      return false;
  }
  return true;
}